

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

int bgzf_index_add_block(BGZF *fp)

{
  int iVar1;
  bgzidx_t *pbVar2;
  bgzidx1_t *pbVar3;
  uint uVar4;
  
  pbVar2 = fp->idx;
  uVar4 = pbVar2->noffs;
  pbVar2->noffs = uVar4 + 1;
  if (pbVar2->moffs <= (int)uVar4) {
    uVar4 = (int)uVar4 >> 1 | uVar4;
    uVar4 = (int)uVar4 >> 2 | uVar4;
    uVar4 = (int)uVar4 >> 4 | uVar4;
    uVar4 = (int)uVar4 >> 8 | uVar4;
    uVar4 = (int)uVar4 >> 0x10 | uVar4;
    pbVar2->moffs = uVar4 + 1;
    pbVar3 = (bgzidx1_t *)realloc(pbVar2->offs,(long)(int)uVar4 * 0x10 + 0x10);
    fp->idx->offs = pbVar3;
    if (pbVar3 == (bgzidx1_t *)0x0) {
      return -1;
    }
  }
  pbVar2 = fp->idx;
  pbVar3 = pbVar2->offs;
  iVar1 = pbVar2->noffs;
  pbVar3[(long)iVar1 + -1].uaddr = pbVar2->ublock_addr;
  pbVar3[(long)iVar1 + -1].caddr = fp->block_address;
  return 0;
}

Assistant:

int bgzf_index_add_block(BGZF *fp)
{
    fp->idx->noffs++;
    if ( fp->idx->noffs > fp->idx->moffs )
    {
        fp->idx->moffs = fp->idx->noffs;
        kroundup32(fp->idx->moffs);
        fp->idx->offs = (bgzidx1_t*) realloc(fp->idx->offs, fp->idx->moffs*sizeof(bgzidx1_t));
        if ( !fp->idx->offs ) return -1;
    }
    fp->idx->offs[ fp->idx->noffs-1 ].uaddr = fp->idx->ublock_addr;
    fp->idx->offs[ fp->idx->noffs-1 ].caddr = fp->block_address;
    return 0;
}